

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BeagleCPUImpl.hpp
# Opt level: O2

void __thiscall
beagle::cpu::BeagleCPUImpl<float,_1,_0>::rescalePartialsByPartition
          (BeagleCPUImpl<float,_1,_0> *this,float *destP,float *scaleFactors,
          float *cumulativeScaleFactors,int fillWithOnes,int partitionIndex)

{
  int iVar1;
  undefined1 auVar2 [16];
  undefined8 uVar3;
  bool bVar4;
  long lVar5;
  int iVar6;
  int iVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  int iVar11;
  long lVar12;
  int k;
  long lVar13;
  float fVar14;
  double dVar15;
  undefined1 auVar16 [64];
  
  lVar13 = (long)this->gPatternPartitionsStartPatterns[partitionIndex];
  iVar1 = this->gPatternPartitionsStartPatterns[(long)partitionIndex + 1];
  do {
    if (iVar1 <= lVar13) {
      return;
    }
    auVar16 = ZEXT1664(ZEXT816(0) << 0x40);
    iVar7 = (int)lVar13 * this->kPartialsPaddedStateCount;
    iVar6 = this->kPartialsPaddedStateCount * this->kPaddedPatternCount;
    uVar8 = ~(this->kStateCount >> 0x1f) & this->kStateCount;
    uVar9 = ~(this->kCategoryCount >> 0x1f) & this->kCategoryCount;
    iVar11 = iVar7;
    for (uVar10 = 0; uVar10 != uVar9; uVar10 = uVar10 + 1) {
      lVar12 = 0;
      while (uVar8 != (uint)lVar12) {
        lVar5 = iVar11 + lVar12;
        lVar12 = lVar12 + 1;
        auVar2 = vmaxss_avx(ZEXT416((uint)destP[lVar5]),auVar16._0_16_);
        auVar16 = ZEXT1664(auVar2);
      }
      iVar11 = iVar11 + iVar6;
    }
    uVar3 = vcmpss_avx512f(auVar16._0_16_,ZEXT416(0),0);
    bVar4 = (bool)((byte)uVar3 & 1);
    fVar14 = (float)((uint)bVar4 * 0x3f800000 + (uint)!bVar4 * auVar16._0_4_);
    for (uVar10 = 0; uVar10 != uVar9; uVar10 = uVar10 + 1) {
      for (lVar12 = 0; uVar8 != (uint)lVar12; lVar12 = lVar12 + 1) {
        destP[iVar7 + lVar12] = (1.0 / fVar14) * destP[iVar7 + lVar12];
      }
      iVar7 = iVar7 + iVar6;
    }
    if ((this->kFlags & 0x400) == 0) {
      scaleFactors[lVar13] = fVar14;
      if (cumulativeScaleFactors != (float *)0x0) {
        dVar15 = log((double)fVar14);
        fVar14 = (float)(dVar15 + (double)cumulativeScaleFactors[lVar13]);
LAB_00146bd9:
        cumulativeScaleFactors[lVar13] = fVar14;
      }
    }
    else {
      dVar15 = log((double)fVar14);
      scaleFactors[lVar13] = (float)dVar15;
      if (cumulativeScaleFactors != (float *)0x0) {
        fVar14 = (float)dVar15 + cumulativeScaleFactors[lVar13];
        goto LAB_00146bd9;
      }
    }
    lVar13 = lVar13 + 1;
  } while( true );
}

Assistant:

BEAGLE_CPU_TEMPLATE
void BeagleCPUImpl<BEAGLE_CPU_GENERIC>::rescalePartialsByPartition(REALTYPE* destP,
                                                                   REALTYPE* scaleFactors,
                                                                   REALTYPE* cumulativeScaleFactors,
                                                                   const int fillWithOnes,
                                                                   const int partitionIndex) {

    int startPattern = gPatternPartitionsStartPatterns[partitionIndex];
    int endPattern = gPatternPartitionsStartPatterns[partitionIndex + 1];

    // TODO None of the code below has been optimized.
    for (int k = startPattern; k < endPattern; k++) {
        REALTYPE max = 0;
        const int patternOffset = k * kPartialsPaddedStateCount;
        for (int l = 0; l < kCategoryCount; l++) {
            int offset = l * kPaddedPatternCount * kPartialsPaddedStateCount + patternOffset;
            for (int i = 0; i < kStateCount; i++) {
                if(destP[offset] > max)
                    max = destP[offset];
                offset++;
            }
        }

        if (max == 0)
            max = 1.0;

        REALTYPE oneOverMax = REALTYPE(1.0) / max;
        for (int l = 0; l < kCategoryCount; l++) {
            int offset = l * kPaddedPatternCount * kPartialsPaddedStateCount + patternOffset;
            for (int i = 0; i < kStateCount; i++)
                destP[offset++] *= oneOverMax;
        }

        if (kFlags & BEAGLE_FLAG_SCALERS_LOG) {
            REALTYPE logMax = log(max);
            scaleFactors[k] = logMax;
            if( cumulativeScaleFactors != NULL )
                cumulativeScaleFactors[k] += logMax;
        } else {
            scaleFactors[k] = max;
            if( cumulativeScaleFactors != NULL )
                cumulativeScaleFactors[k] += log(max);
        }
    }
}